

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall Cube::setupLeftFace(Cube *this)

{
  float fVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  
  fVar1 = this->x;
  this->positionData[0x24] = fVar1;
  this->positionData[0x27] = fVar1;
  this->positionData[0x2a] = fVar1;
  uVar3._0_4_ = this->y;
  uVar3._4_4_ = this->z;
  uVar2 = this->b;
  uVar4 = this->h;
  uVar5 = CONCAT44((float)uVar2 + (float)uVar3._4_4_,(float)uVar4 + (float)(undefined4)uVar3);
  *(undefined8 *)(this->positionData + 0x25) = uVar3;
  this->positionData[0x28] = (float)uVar4 + (float)(undefined4)uVar3;
  this->positionData[0x29] = (float)uVar3._4_4_;
  *(undefined8 *)(this->positionData + 0x2b) = uVar5;
  this->positionData[0x2d] = fVar1;
  *(undefined8 *)(this->positionData + 0x2e) = uVar3;
  this->positionData[0x30] = fVar1;
  *(undefined8 *)(this->positionData + 0x31) = uVar5;
  this->positionData[0x33] = fVar1;
  this->positionData[0x34] = (float)(undefined4)uVar3;
  this->positionData[0x35] = (float)uVar2 + (float)uVar3._4_4_;
  return;
}

Assistant:

void setupLeftFace() {
        float leftFace[]={
            x,y,z,

            x,y+h,z,
            x,y+h,z+b,
            x,y,z,
            x,y+h,z+b,
            x,y,z+b
        };
        arrayCopy(leftFace,positionData,36);
    }